

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::OneHotEncoder::SharedCtor(OneHotEncoder *this)

{
  this->outputsparse_ = false;
  *(undefined3 *)&this->field_0x11 = 0;
  this->handleunknown_ = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void OneHotEncoder::SharedCtor() {
  ::memset(&outputsparse_, 0, reinterpret_cast<char*>(&handleunknown_) -
    reinterpret_cast<char*>(&outputsparse_) + sizeof(handleunknown_));
  clear_has_CategoryType();
  _cached_size_ = 0;
}